

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralMatrixVector.h
# Opt level: O2

void Eigen::internal::general_matrix_vector_product<long,_double,_0,_false,_double,_false,_0>::run
               (long rows,long cols,double *lhs,long lhsStride,double *rhs,long rhsIncr,
               ResScalar *res,long resIncr,double alpha)

{
  double dVar1;
  double dVar2;
  double dVar3;
  long lVar4;
  double *pdVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  long j_1;
  long lVar9;
  long j_5;
  ulong uVar10;
  ulong uVar11;
  double *pdVar12;
  double *pdVar13;
  long j;
  ulong uVar14;
  long lVar15;
  double *pdVar16;
  double dVar17;
  double dVar18;
  long local_c0;
  ulong local_b8;
  
  uVar6 = (ulong)((uint)((ulong)res >> 3) & 1);
  if (rows <= (long)uVar6) {
    uVar6 = rows;
  }
  if (((ulong)res & 7) != 0) {
    uVar6 = rows;
  }
  uVar11 = (ulong)((uint)lhsStride & 1);
  uVar10 = (ulong)((uint)((ulong)lhs >> 3) & 1);
  if (rows <= (long)uVar10) {
    uVar10 = rows;
  }
  if (((ulong)lhs & 7) != 0) {
    uVar10 = rows;
  }
  if ((((uint)res | (uint)lhs) & 7) == 0) {
    lVar8 = (rows - uVar6 & 0xfffffffffffffffe) + uVar6;
    local_b8 = 3;
    for (lVar4 = 0; lVar9 = 0, lVar4 != 2; lVar4 = lVar4 + 1) {
      if (uVar6 == (long)uVar10 % 2) {
        lVar9 = lVar4;
        local_b8 = uVar11;
        if (cols <= lVar4) {
          lVar9 = cols;
        }
        break;
      }
      uVar10 = uVar10 + uVar11;
    }
  }
  else {
    lVar8 = 0;
    uVar6 = 0;
    lVar9 = 0;
    local_b8 = uVar11;
  }
  lVar4 = ((cols - lVar9) / 4) * 4 + lVar9;
  uVar10 = 0;
  if (0 < (long)uVar6) {
    uVar10 = uVar6;
  }
  pdVar13 = lhs + lVar9 * lhsStride;
  pdVar16 = lhs + (uVar11 * 2 + 1 + lVar9) * lhsStride;
  pdVar12 = lhs + (lVar9 + 2) * lhsStride;
  pdVar5 = lhs + (lVar9 + (ulong)(uVar11 == 0) * 2 + 1) * lhsStride;
  lVar7 = lVar9;
  while( true ) {
    if (lVar4 <= lVar7) {
      local_c0 = cols;
      do {
        lVar7 = lVar9;
        pdVar13 = (double *)(lhsStride * 8 * lVar4 + (long)lhs);
        for (; lVar4 < local_c0; lVar4 = lVar4 + 1) {
          dVar17 = rhs[lVar4 * rhsIncr] * alpha;
          for (uVar11 = 0; uVar10 != uVar11; uVar11 = uVar11 + 1) {
            res[uVar11] = pdVar13[uVar11] * dVar17 + res[uVar11];
          }
          uVar11 = uVar6;
          lVar9 = lVar8;
          if (((int)lVar4 * (uint)lhsStride * 8 + (uint)lhs + (int)uVar6 * 8 & 0xf) == 0) {
            for (; (long)uVar11 < lVar8; uVar11 = uVar11 + 2) {
              dVar2 = (pdVar13 + uVar11)[1];
              dVar1 = (res + uVar11)[1];
              res[uVar11] = pdVar13[uVar11] * dVar17 + res[uVar11];
              (res + uVar11)[1] = dVar2 * dVar17 + dVar1;
            }
          }
          else {
            for (; (long)uVar11 < lVar8; uVar11 = uVar11 + 2) {
              dVar2 = (pdVar13 + uVar11)[1];
              dVar1 = (res + uVar11)[1];
              res[uVar11] = pdVar13[uVar11] * dVar17 + res[uVar11];
              (res + uVar11)[1] = dVar2 * dVar17 + dVar1;
            }
          }
          for (; lVar9 < rows; lVar9 = lVar9 + 1) {
            res[lVar9] = pdVar13[lVar9] * dVar17 + res[lVar9];
          }
          pdVar13 = pdVar13 + lhsStride;
        }
        lVar4 = 0;
        lVar9 = 0;
        local_c0 = lVar7;
      } while (lVar7 != 0);
      return;
    }
    dVar17 = rhs[lVar7 * rhsIncr];
    dVar1 = rhs[(lVar7 + uVar11 * 2 + 1) * rhsIncr];
    dVar2 = rhs[(lVar7 + 2) * rhsIncr];
    dVar3 = rhs[((ulong)(uVar11 == 0) * 2 + 1 + lVar7) * rhsIncr];
    for (uVar14 = 0; uVar10 != uVar14; uVar14 = uVar14 + 1) {
      dVar18 = pdVar13[uVar14] * dVar17 * alpha + res[uVar14];
      res[uVar14] = dVar18;
      dVar18 = pdVar16[uVar14] * dVar1 * alpha + dVar18;
      res[uVar14] = dVar18;
      dVar18 = pdVar12[uVar14] * dVar2 * alpha + dVar18;
      res[uVar14] = dVar18;
      res[uVar14] = pdVar5[uVar14] * dVar3 * alpha + dVar18;
    }
    lVar15 = lVar8;
    if ((long)uVar6 < lVar8) break;
    for (; lVar15 < rows; lVar15 = lVar15 + 1) {
      dVar18 = pdVar13[lVar15] * dVar17 * alpha + res[lVar15];
      res[lVar15] = dVar18;
      dVar18 = pdVar16[lVar15] * dVar1 * alpha + dVar18;
      res[lVar15] = dVar18;
      dVar18 = pdVar12[lVar15] * dVar2 * alpha + dVar18;
      res[lVar15] = dVar18;
      res[lVar15] = pdVar5[lVar15] * dVar3 * alpha + dVar18;
    }
    lVar7 = lVar7 + 4;
    pdVar13 = pdVar13 + lhsStride * 4;
    pdVar16 = pdVar16 + lhsStride * 4;
    pdVar12 = pdVar12 + lhsStride * 4;
    pdVar5 = pdVar5 + lhsStride * 4;
  }
  (*(code *)(&DAT_0010ec18 + *(int *)(&DAT_0010ec18 + local_b8 * 4)))();
  return;
}

Assistant:

EIGEN_DONT_INLINE void general_matrix_vector_product<Index,LhsScalar,ColMajor,ConjugateLhs,RhsScalar,ConjugateRhs,Version>::run(
  Index rows, Index cols,
  const LhsScalar* lhs, Index lhsStride,
  const RhsScalar* rhs, Index rhsIncr,
  ResScalar* res, Index resIncr, RhsScalar alpha)
{
  EIGEN_UNUSED_VARIABLE(resIncr)
  eigen_internal_assert(resIncr==1);
  #ifdef _EIGEN_ACCUMULATE_PACKETS
  #error _EIGEN_ACCUMULATE_PACKETS has already been defined
  #endif
  #define _EIGEN_ACCUMULATE_PACKETS(A0,A13,A2) \
    pstore(&res[j], \
      padd(pload<ResPacket>(&res[j]), \
        padd( \
          padd(pcj.pmul(EIGEN_CAT(ploa , A0)<LhsPacket>(&lhs0[j]),    ptmp0), \
                  pcj.pmul(EIGEN_CAT(ploa , A13)<LhsPacket>(&lhs1[j]),   ptmp1)), \
          padd(pcj.pmul(EIGEN_CAT(ploa , A2)<LhsPacket>(&lhs2[j]),    ptmp2), \
                  pcj.pmul(EIGEN_CAT(ploa , A13)<LhsPacket>(&lhs3[j]),   ptmp3)) )))

  conj_helper<LhsScalar,RhsScalar,ConjugateLhs,ConjugateRhs> cj;
  conj_helper<LhsPacket,RhsPacket,ConjugateLhs,ConjugateRhs> pcj;
  if(ConjugateRhs)
    alpha = numext::conj(alpha);

  enum { AllAligned = 0, EvenAligned, FirstAligned, NoneAligned };
  const Index columnsAtOnce = 4;
  const Index peels = 2;
  const Index LhsPacketAlignedMask = LhsPacketSize-1;
  const Index ResPacketAlignedMask = ResPacketSize-1;
//  const Index PeelAlignedMask = ResPacketSize*peels-1;
  const Index size = rows;
  
  // How many coeffs of the result do we have to skip to be aligned.
  // Here we assume data are at least aligned on the base scalar type.
  Index alignedStart = internal::first_aligned(res,size);
  Index alignedSize = ResPacketSize>1 ? alignedStart + ((size-alignedStart) & ~ResPacketAlignedMask) : 0;
  const Index peeledSize = alignedSize - RhsPacketSize*peels - RhsPacketSize + 1;

  const Index alignmentStep = LhsPacketSize>1 ? (LhsPacketSize - lhsStride % LhsPacketSize) & LhsPacketAlignedMask : 0;
  Index alignmentPattern = alignmentStep==0 ? AllAligned
                       : alignmentStep==(LhsPacketSize/2) ? EvenAligned
                       : FirstAligned;

  // we cannot assume the first element is aligned because of sub-matrices
  const Index lhsAlignmentOffset = internal::first_aligned(lhs,size);

  // find how many columns do we have to skip to be aligned with the result (if possible)
  Index skipColumns = 0;
  // if the data cannot be aligned (TODO add some compile time tests when possible, e.g. for floats)
  if( (size_t(lhs)%sizeof(LhsScalar)) || (size_t(res)%sizeof(ResScalar)) )
  {
    alignedSize = 0;
    alignedStart = 0;
  }
  else if (LhsPacketSize>1)
  {
    eigen_internal_assert(size_t(lhs+lhsAlignmentOffset)%sizeof(LhsPacket)==0 || size<LhsPacketSize);

    while (skipColumns<LhsPacketSize &&
          alignedStart != ((lhsAlignmentOffset + alignmentStep*skipColumns)%LhsPacketSize))
      ++skipColumns;
    if (skipColumns==LhsPacketSize)
    {
      // nothing can be aligned, no need to skip any column
      alignmentPattern = NoneAligned;
      skipColumns = 0;
    }
    else
    {
      skipColumns = (std::min)(skipColumns,cols);
      // note that the skiped columns are processed later.
    }

    eigen_internal_assert(  (alignmentPattern==NoneAligned)
                      || (skipColumns + columnsAtOnce >= cols)
                      || LhsPacketSize > size
                      || (size_t(lhs+alignedStart+lhsStride*skipColumns)%sizeof(LhsPacket))==0);
  }
  else if(Vectorizable)
  {
    alignedStart = 0;
    alignedSize = size;
    alignmentPattern = AllAligned;
  }

  Index offset1 = (FirstAligned && alignmentStep==1?3:1);
  Index offset3 = (FirstAligned && alignmentStep==1?1:3);

  Index columnBound = ((cols-skipColumns)/columnsAtOnce)*columnsAtOnce + skipColumns;
  for (Index i=skipColumns; i<columnBound; i+=columnsAtOnce)
  {
    RhsPacket ptmp0 = pset1<RhsPacket>(alpha*rhs[i*rhsIncr]),
              ptmp1 = pset1<RhsPacket>(alpha*rhs[(i+offset1)*rhsIncr]),
              ptmp2 = pset1<RhsPacket>(alpha*rhs[(i+2)*rhsIncr]),
              ptmp3 = pset1<RhsPacket>(alpha*rhs[(i+offset3)*rhsIncr]);

    // this helps a lot generating better binary code
    const LhsScalar *lhs0 = lhs + i*lhsStride,     *lhs1 = lhs + (i+offset1)*lhsStride,
                    *lhs2 = lhs + (i+2)*lhsStride, *lhs3 = lhs + (i+offset3)*lhsStride;

    if (Vectorizable)
    {
      /* explicit vectorization */
      // process initial unaligned coeffs
      for (Index j=0; j<alignedStart; ++j)
      {
        res[j] = cj.pmadd(lhs0[j], pfirst(ptmp0), res[j]);
        res[j] = cj.pmadd(lhs1[j], pfirst(ptmp1), res[j]);
        res[j] = cj.pmadd(lhs2[j], pfirst(ptmp2), res[j]);
        res[j] = cj.pmadd(lhs3[j], pfirst(ptmp3), res[j]);
      }

      if (alignedSize>alignedStart)
      {
        switch(alignmentPattern)
        {
          case AllAligned:
            for (Index j = alignedStart; j<alignedSize; j+=ResPacketSize)
              _EIGEN_ACCUMULATE_PACKETS(d,d,d);
            break;
          case EvenAligned:
            for (Index j = alignedStart; j<alignedSize; j+=ResPacketSize)
              _EIGEN_ACCUMULATE_PACKETS(d,du,d);
            break;
          case FirstAligned:
          {
            Index j = alignedStart;
            if(peels>1)
            {
              LhsPacket A00, A01, A02, A03, A10, A11, A12, A13;
              ResPacket T0, T1;

              A01 = pload<LhsPacket>(&lhs1[alignedStart-1]);
              A02 = pload<LhsPacket>(&lhs2[alignedStart-2]);
              A03 = pload<LhsPacket>(&lhs3[alignedStart-3]);

              for (; j<peeledSize; j+=peels*ResPacketSize)
              {
                A11 = pload<LhsPacket>(&lhs1[j-1+LhsPacketSize]);  palign<1>(A01,A11);
                A12 = pload<LhsPacket>(&lhs2[j-2+LhsPacketSize]);  palign<2>(A02,A12);
                A13 = pload<LhsPacket>(&lhs3[j-3+LhsPacketSize]);  palign<3>(A03,A13);

                A00 = pload<LhsPacket>(&lhs0[j]);
                A10 = pload<LhsPacket>(&lhs0[j+LhsPacketSize]);
                T0  = pcj.pmadd(A00, ptmp0, pload<ResPacket>(&res[j]));
                T1  = pcj.pmadd(A10, ptmp0, pload<ResPacket>(&res[j+ResPacketSize]));

                T0  = pcj.pmadd(A01, ptmp1, T0);
                A01 = pload<LhsPacket>(&lhs1[j-1+2*LhsPacketSize]);  palign<1>(A11,A01);
                T0  = pcj.pmadd(A02, ptmp2, T0);
                A02 = pload<LhsPacket>(&lhs2[j-2+2*LhsPacketSize]);  palign<2>(A12,A02);
                T0  = pcj.pmadd(A03, ptmp3, T0);
                pstore(&res[j],T0);
                A03 = pload<LhsPacket>(&lhs3[j-3+2*LhsPacketSize]);  palign<3>(A13,A03);
                T1  = pcj.pmadd(A11, ptmp1, T1);
                T1  = pcj.pmadd(A12, ptmp2, T1);
                T1  = pcj.pmadd(A13, ptmp3, T1);
                pstore(&res[j+ResPacketSize],T1);
              }
            }
            for (; j<alignedSize; j+=ResPacketSize)
              _EIGEN_ACCUMULATE_PACKETS(d,du,du);
            break;
          }
          default:
            for (Index j = alignedStart; j<alignedSize; j+=ResPacketSize)
              _EIGEN_ACCUMULATE_PACKETS(du,du,du);
            break;
        }
      }
    } // end explicit vectorization

    /* process remaining coeffs (or all if there is no explicit vectorization) */
    for (Index j=alignedSize; j<size; ++j)
    {
      res[j] = cj.pmadd(lhs0[j], pfirst(ptmp0), res[j]);
      res[j] = cj.pmadd(lhs1[j], pfirst(ptmp1), res[j]);
      res[j] = cj.pmadd(lhs2[j], pfirst(ptmp2), res[j]);
      res[j] = cj.pmadd(lhs3[j], pfirst(ptmp3), res[j]);
    }
  }

  // process remaining first and last columns (at most columnsAtOnce-1)
  Index end = cols;
  Index start = columnBound;
  do
  {
    for (Index k=start; k<end; ++k)
    {
      RhsPacket ptmp0 = pset1<RhsPacket>(alpha*rhs[k*rhsIncr]);
      const LhsScalar* lhs0 = lhs + k*lhsStride;

      if (Vectorizable)
      {
        /* explicit vectorization */
        // process first unaligned result's coeffs
        for (Index j=0; j<alignedStart; ++j)
          res[j] += cj.pmul(lhs0[j], pfirst(ptmp0));
        // process aligned result's coeffs
        if ((size_t(lhs0+alignedStart)%sizeof(LhsPacket))==0)
          for (Index i = alignedStart;i<alignedSize;i+=ResPacketSize)
            pstore(&res[i], pcj.pmadd(pload<LhsPacket>(&lhs0[i]), ptmp0, pload<ResPacket>(&res[i])));
        else
          for (Index i = alignedStart;i<alignedSize;i+=ResPacketSize)
            pstore(&res[i], pcj.pmadd(ploadu<LhsPacket>(&lhs0[i]), ptmp0, pload<ResPacket>(&res[i])));
      }

      // process remaining scalars (or all if no explicit vectorization)
      for (Index i=alignedSize; i<size; ++i)
        res[i] += cj.pmul(lhs0[i], pfirst(ptmp0));
    }
    if (skipColumns)
    {
      start = 0;
      end = skipColumns;
      skipColumns = 0;
    }
    else
      break;
  } while(Vectorizable);
  #undef _EIGEN_ACCUMULATE_PACKETS
}